

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadLocalStorage.h
# Opt level: O2

void __thiscall TLS::BASE<tls_data_t,_1024U>::_details::~_details(_details *this)

{
  data_t *__args;
  long lVar1;
  
  pthread_key_delete(BASE<tls_data_t,1024u>::_details::_pthread_key);
  if (BASE<tls_data_t,1024u>::_details::_thread_exit_callback !=
      (function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)> *)0x0) {
    __args = (this->_data)._M_elems;
    for (lVar1 = 0x6000; lVar1 != 0; lVar1 = lVar1 + -0x18) {
      if (__args->_index != 0xffffffff) {
        std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>::operator()
                  (BASE<tls_data_t,1024u>::_details::_thread_exit_callback,__args);
      }
      __args = __args + 1;
    }
  }
  return;
}

Assistant:

~_details() {
#ifdef _MSC_VER
				for (auto & x : _thread_wait_handles) {
					if (x != IVH())
						unregister_wait_thread_handle(x);
				}
#else
				int result = pthread_key_delete(_pthread_key);
				TLS_ASSERT_(result == 0); (void)result;
#endif
				if (_thread_exit_callback) {
					for (auto &x : _data) {
						if (x._index != UNUSED_INDEX)
							_thread_exit_callback->operator()(x);
					}
				}
			}